

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupTeamCityOutputTest::setup(TEST_GROUP_CppUTestGroupTeamCityOutputTest *this)

{
  TeamCityOutputToBuffer *this_00;
  UtestShell *pUVar1;
  TestFailure *pTVar2;
  TestResult *this_01;
  SimpleString local_60;
  undefined1 local_49;
  SimpleString local_48;
  undefined1 local_31;
  SimpleString local_30 [2];
  TEST_GROUP_CppUTestGroupTeamCityOutputTest *local_10;
  TEST_GROUP_CppUTestGroupTeamCityOutputTest *this_local;
  
  local_10 = this;
  this_00 = (TeamCityOutputToBuffer *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x38);
  TeamCityOutputToBuffer::TeamCityOutputToBuffer(this_00);
  this->mock = this_00;
  this->tcout = &this->mock->super_TeamCityTestOutput;
  pUVar1 = (UtestShell *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3a);
  UtestShell::UtestShell(pUVar1,"group","test","file",10);
  this->tst = pUVar1;
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3b);
  local_31 = 1;
  pUVar1 = this->tst;
  SimpleString::SimpleString(local_30,"failure message");
  TestFailure::TestFailure(pTVar2,pUVar1,"failfile",0x14,local_30);
  local_31 = 0;
  this->f = pTVar2;
  SimpleString::~SimpleString(local_30);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3c);
  local_49 = 1;
  pUVar1 = this->tst;
  SimpleString::SimpleString(&local_48,"message");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",0x14,&local_48);
  local_49 = 0;
  this->f2 = pTVar2;
  SimpleString::~SimpleString(&local_48);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3d);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&local_60,"apos\' pipe| [brackets]\r\nCRLF");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",0x1e,&local_60);
  this->f3 = pTVar2;
  SimpleString::~SimpleString(&local_60);
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x3e);
  TestResult::TestResult(this_01,(TestOutput *)this->mock);
  this->result = this_01;
  TestResult::setTotalExecutionTime(this->result,10);
  millisTime = 0;
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  return;
}

Assistant:

void setup() _override
    {
        mock = new TeamCityOutputToBuffer();
        tcout = mock;
        tst = new UtestShell("group", "test", "file", 10);
        f = new TestFailure(tst, "failfile", 20, "failure message");
        f2 = new TestFailure(tst, "file", 20, "message");
        f3 = new TestFailure(tst, "file", 30, "apos' pipe| [brackets]\r\nCRLF");
        result = new TestResult(*mock);
        result->setTotalExecutionTime(10);
        millisTime = 0;
        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
    }